

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QTextBrowserPrivate::HistoryEntry>::end(QList<QTextBrowserPrivate::HistoryEntry> *this)

{
  HistoryEntry *n;
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QTextBrowserPrivate::HistoryEntry> *)0x6e3799);
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::operator->(in_RDI);
  n = QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }